

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::anon_unknown_0::TestGroup::init(TestGroup *this)

{
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  data;
  int extraout_EAX;
  RenderContext *renderCtx;
  TestContext *testCtx;
  ES3Types *this_00;
  Types *types;
  TestCaseGroup *this_01;
  TfDeleteActiveTest *this_02;
  Types *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  TestCaseGroup *deleteActiveGroup;
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  local_48;
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  *local_38;
  undefined1 local_28 [8];
  Context ltCtx;
  Context *ctx;
  TestGroup *this_local;
  
  ltCtx.m_testCtx = (TestContext *)TestCaseGroup::getContext(&this->super_TestCaseGroup);
  renderCtx = gles3::Context::getRenderContext((Context *)ltCtx.m_testCtx);
  testCtx = gles3::Context::getTestContext((Context *)ltCtx.m_testCtx);
  deqp::gls::LifetimeTests::details::Context::Context((Context *)local_28,renderCtx,testCtx);
  this_00 = (ES3Types *)operator_new(0xab0);
  ES3Types::ES3Types(this_00,(Context *)local_28);
  de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>::DefaultDeleter
            ((DefaultDeleter<deqp::gls::LifetimeTests::details::Types> *)
             ((long)&deleteActiveGroup + 3));
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::MovePtr();
  local_38 = de::details::MovePtr::operator_cast_to_PtrData(&local_48,(MovePtr *)this_00);
  data._8_8_ = in_stack_ffffffffffffff60;
  data.ptr = in_stack_ffffffffffffff58;
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::operator=(&this->m_types,data);
  de::details::
  MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  ::~MovePtr((MovePtr<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
              *)&local_48);
  types = de::details::
          UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
          ::operator*(&(this->m_types).
                       super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
                     );
  deqp::gls::LifetimeTests::details::addTestCases((TestCaseGroup *)this,types);
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(Context *)ltCtx.m_testCtx,"delete_active","Delete active object");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TfDeleteActiveTest *)operator_new(0x90);
  TfDeleteActiveTest::TfDeleteActiveTest
            (this_02,(Context *)ltCtx.m_testCtx,"transform_feedback","Transform Feedback");
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	gles3::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types	= MovePtr<Types>(new ES3Types(ltCtx));

	addTestCases(*this, *m_types);

	TestCaseGroup* deleteActiveGroup =
		new TestCaseGroup(ctx, "delete_active", "Delete active object");
	addChild(deleteActiveGroup);
	deleteActiveGroup->addChild(
		new TfDeleteActiveTest(ctx, "transform_feedback", "Transform Feedback"));
}